

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsStoreFS::Write<tcu::Vector<unsigned_int,4>>
          (BasicAllFormatsStoreFS *this,GLenum internalformat,Vector<unsigned_int,_4> *write_value,
          Vector<unsigned_int,_4> *expected_value)

{
  CallLogWrapper *this_00;
  _Alloc_hider _Var1;
  _func_int **pp_Var2;
  GLuint program;
  GLuint program_00;
  ostream *poVar3;
  void *__s;
  uint *puVar4;
  GLenum e;
  GLenum e_00;
  Vector<unsigned_int,_4> *extraout_RDX;
  Vector<unsigned_int,_4> *v;
  Vector<unsigned_int,_4> *v_00;
  uint *puVar5;
  uint *puVar6;
  ShaderImageLoadStoreBase *this_01;
  ulong uVar7;
  bool bVar8;
  string local_268;
  string local_248;
  GLuint m_buffer;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  void *local_208;
  void *local_200;
  Vector<unsigned_int,_4> *local_1f8;
  GLuint texture;
  undefined4 uStack_1ec;
  long local_1e0 [2];
  ShaderImageLoadStoreBase *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ostringstream os;
  
  this_01 = (ShaderImageLoadStoreBase *)(ulong)internalformat;
  local_1f8 = expected_value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&os,"\nlayout(",8);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_248,this_01,e);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,", binding = 2) writeonly uniform ",0x21);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268.field_2._M_allocated_capacity._0_2_ = 0x75;
  local_268._M_string_length = 1;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_268._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, "
             ,100);
  local_218._M_allocated_capacity._0_2_ = 0x75;
  local_220 = 1;
  _m_buffer = (pointer)&local_218;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_218._M_local_buf,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4",4);
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,");\n  discard;\n}",0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_m_buffer != &local_218) {
    operator_delete(_m_buffer,
                    CONCAT62(local_218._M_allocated_capacity._2_6_,
                             local_218._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT62(local_268.field_2._M_allocated_capacity._2_6_,
                             local_268.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT62(local_248.field_2._M_allocated_capacity._2_6_,
                             local_248.field_2._M_allocated_capacity._0_2_) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,
                       "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)CONCAT44(uStack_1ec,texture),false,false);
  if ((long *)CONCAT44(uStack_1ec,texture) != local_1e0) {
    operator_delete((long *)CONCAT44(uStack_1ec,texture),local_1e0[0] + 1);
  }
  local_200 = operator_new(0x790);
  memset(local_200,0,0x790);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,0xb,0xb);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,0xb,0xb);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,texture,0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            (&os.super_basic_ostream<char,_std::char_traits<char>_>,
             "\n#define KSIZE 11\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nuniform "
             ,0x52);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248.field_2._M_allocated_capacity._0_2_ = 0x75;
  local_248._M_string_length = 1;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_248._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"sampler2D g_sampler;\nlayout(std430) buffer OutputBuffer {\n  ",0x3c);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268.field_2._M_allocated_capacity._0_2_ = 0x75;
  local_268._M_string_length = 1;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_268._M_dataplus._M_p,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  data[gl_LocalInvocationIndex] = texelFetch(g_sampler, ivec2(gl_LocalInvocationID), 0);\n  //data[gl_LocalInvocationIndex] = "
             ,0xa6);
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n}",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT62(local_268.field_2._M_allocated_capacity._2_6_,
                             local_268.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT62(local_248.field_2._M_allocated_capacity._2_6_,
                             local_248.field_2._M_allocated_capacity._0_2_) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program_00 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                         ((ShaderImageLoadStoreBase *)this,(string *)&m_buffer,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_m_buffer != &local_218) {
    operator_delete(_m_buffer,
                    CONCAT62(local_218._M_allocated_capacity._2_6_,
                             local_218._M_allocated_capacity._0_2_) + 1);
  }
  __s = operator_new(0x790);
  memset(__s,0,0x790);
  local_208 = __s;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x790,__s,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,program_00);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  bVar8 = false;
  puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x790,1);
  local_1d0 = this_01;
  if (*puVar4 == local_1f8->m_data[0]) {
    v = (Vector<unsigned_int,_4> *)(ulong)local_1f8->m_data[1];
    uVar7 = 0;
    bVar8 = false;
    puVar5 = puVar4;
    do {
      puVar6 = puVar4 + uVar7 * 4;
      if (((puVar5[1] != local_1f8->m_data[1]) ||
          (puVar6 = puVar5, puVar5[2] != local_1f8->m_data[2])) ||
         (puVar6 = puVar4 + uVar7 * 4, puVar5[3] != local_1f8->m_data[3])) goto LAB_00c4e107;
      bVar8 = 0x77 < uVar7;
      if (uVar7 == 0x78) {
        glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glDeleteProgram(this_00,program);
        glu::CallLogWrapper::glDeleteProgram(this_00,program_00);
        glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
        goto LAB_00c4e229;
      }
      uVar7 = uVar7 + 1;
      puVar6 = puVar5 + 4;
      puVar5 = puVar5 + 4;
    } while (*puVar6 == local_1f8->m_data[0]);
    puVar6 = puVar4 + uVar7 * 4;
  }
  else {
    uVar7 = 0;
    v = extraout_RDX;
    puVar6 = puVar4;
  }
LAB_00c4e107:
  local_1b8 = *(undefined8 *)puVar6;
  uStack_1b0 = *(undefined8 *)(puVar6 + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
            ((string *)&os,(ShaderImageLoadStoreBase *)&local_1b8,v);
  pp_Var2 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  local_1c8 = *(undefined8 *)local_1f8->m_data;
  uStack_1c0 = *(undefined8 *)(local_1f8->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
            (&local_248,(ShaderImageLoadStoreBase *)&local_1c8,v_00);
  _Var1._M_p = local_248._M_dataplus._M_p;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_268,local_1d0,e_00);
  glcts::anon_unknown_0::Output
            ("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
             uVar7 & 0xffffffff,pp_Var2,_Var1._M_p,local_268._M_dataplus._M_p,2);
  __s = local_208;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT62(local_268.field_2._M_allocated_capacity._2_6_,
                             local_268.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT62(local_248.field_2._M_allocated_capacity._2_6_,
                             local_248.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  glu::CallLogWrapper::glDeleteProgram(this_00,program_00);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
LAB_00c4e229:
  operator_delete(__s,0x790);
  operator_delete(local_200,0x790);
  return bVar8;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		GLuint		   program = BuildProgram(src_vs, GenFS(internalformat, write_value).c_str());
		const int	  kSize   = 11;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture;
		glGenTextures(1, &texture);
		glUseProgram(program);

		GLuint unit = 2;
		glBindTexture(GL_TEXTURE_2D, texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		glBindTexture(GL_TEXTURE_2D, 0);

		glViewport(0, 0, kSize, kSize);
		glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glBindTexture(GL_TEXTURE_2D, texture);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

		GLuint		   c_program = CreateComputeProgram(GenC(write_value));
		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n", i,
					   ToString(map_data[i]).c_str(), ToString(expected_value).c_str(),
					   FormatEnumToString(internalformat).c_str(), unit);
				glDeleteTextures(1, &texture);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteProgram(c_program);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(c_program);
		glDeleteBuffers(1, &m_buffer);
		return true;
	}